

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::applyOperationT<fe::operations::op_blit_colored,fe::PixelA8,fe::PixelB8G8R8A8>
               (op_blit_colored *op,PixelA8 *srcPixelFormat,PixelB8G8R8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  uint8_t *puVar9;
  byte *pbVar10;
  int iVar11;
  uint8_t *puVar12;
  byte *pbVar13;
  
  bVar8 = check(src,dest);
  if ((bVar8) && (iVar5 = (dest->super_fe_image).h, iVar5 != 0)) {
    iVar6 = (dest->super_fe_image).w;
    puVar12 = (dest->super_fe_image).data;
    pbVar13 = (src->super_fe_image).data;
    iVar11 = 0;
    iVar7 = iVar6;
    pbVar10 = pbVar13;
    puVar9 = puVar12;
    do {
      for (; iVar7 != 0; iVar7 = iVar7 + -1) {
        bVar1 = *pbVar13;
        bVar2 = (op->color).field_0.field_0.bytes[1];
        bVar3 = (op->color).field_0.field_0.bytes[2];
        bVar4 = (op->color).field_0.field_0.bytes[3];
        puVar12[2] = (uint8_t)(((uint)(op->color).field_0.field_0.bytes[0] * (uint)bVar1) / 0xff);
        puVar12[1] = (uint8_t)(((uint)bVar2 * (uint)bVar1) / 0xff);
        *puVar12 = (uint8_t)(((uint)bVar3 * (uint)bVar1) / 0xff);
        puVar12[3] = (uint8_t)(((uint)bVar4 * (uint)bVar1) / 0xff);
        puVar12 = puVar12 + (dest->super_fe_image).bytespp;
        pbVar13 = pbVar13 + (src->super_fe_image).bytespp;
      }
      pbVar13 = pbVar10 + (src->super_fe_image).pitch;
      puVar12 = puVar9 + (dest->super_fe_image).pitch;
      iVar11 = iVar11 + 1;
      iVar7 = iVar6;
      pbVar10 = pbVar13;
      puVar9 = puVar12;
    } while (iVar11 != iVar5);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }